

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

uint64 __thiscall google::protobuf::Arena::SpaceUsed(Arena *this)

{
  long local_20;
  Block *b;
  uint64 space_used;
  Arena *this_local;
  
  b = (Block *)0x0;
  for (local_20 = internal::NoBarrier_Load((Atomic64 *)(this + 8)); local_20 != 0;
      local_20 = *(long *)(local_20 + 8)) {
    b = (Block *)((long)&b[-1].owner + *(long *)(local_20 + 0x10));
  }
  return (uint64)b;
}

Assistant:

uint64 Arena::SpaceUsed() const {
  uint64 space_used = 0;
  Block* b = reinterpret_cast<Block*>(google::protobuf::internal::NoBarrier_Load(&blocks_));
  while (b != NULL) {
    space_used += (b->pos - kHeaderSize);
    b = b->next;
  }
  return space_used;
}